

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<float>::Resize(RepeatedField<float> *this,int new_size,float *value)

{
  int iVar1;
  LogMessage *other;
  float *pfVar2;
  float *pfVar3;
  LogFinisher local_6d [20];
  byte local_59;
  LogMessage local_58;
  float *local_20;
  float *value_local;
  RepeatedField<float> *pRStack_10;
  int new_size_local;
  RepeatedField<float> *this_local;
  
  local_59 = 0;
  local_20 = value;
  value_local._4_4_ = new_size;
  pRStack_10 = this;
  if (new_size < 0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x275);
    local_59 = 1;
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: (new_size) >= (0): ");
    internal::LogFinisher::operator=(local_6d,other);
  }
  if ((local_59 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_58);
  }
  if (this->current_size_ < value_local._4_4_) {
    Reserve(this,value_local._4_4_);
    pfVar2 = elements(this);
    iVar1 = this->current_size_;
    pfVar3 = elements(this);
    std::fill<float*,float>(pfVar2 + iVar1,pfVar3 + value_local._4_4_,local_20);
  }
  this->current_size_ = value_local._4_4_;
  return;
}

Assistant:

inline void RepeatedField<Element>::Resize(int new_size, const Element& value) {
  GOOGLE_DCHECK_GE(new_size, 0);
  if (new_size > current_size_) {
    Reserve(new_size);
    std::fill(&elements()[current_size_], &elements()[new_size], value);
  }
  current_size_ = new_size;
}